

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::ExclusiveJoinPromiseNode::~ExclusiveJoinPromiseNode(ExclusiveJoinPromiseNode *this)

{
  long in_FS_OFFSET;
  
  Branch::~Branch(&this->right);
  Branch::~Branch(&this->left);
  if (*(long *)(in_FS_OFFSET + -0x28) == 0) {
    return;
  }
  AsyncObject::failed();
}

Assistant:

ExclusiveJoinPromiseNode::~ExclusiveJoinPromiseNode() noexcept(false) {}